

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v11::detail::to_pointer<char>(basic_appender<char> it,size_t n)

{
  container_type *this;
  buffer<char> *this_00;
  size_t sVar1;
  long in_RSI;
  size_t size;
  buffer<char> *buf;
  container_type *new_capacity;
  basic_appender<char> in_stack_ffffffffffffffd0;
  char *local_8;
  
  this = get_container<fmt::v11::basic_appender<char>>(in_stack_ffffffffffffffd0);
  new_capacity = this;
  buffer<char>::size(this);
  buffer<char>::try_reserve(in_stack_ffffffffffffffd0.container,(size_t)new_capacity);
  this_00 = (buffer<char> *)buffer<char>::size(this);
  sVar1 = buffer<char>::capacity(this);
  if (sVar1 < (ulong)((long)&this_00->ptr_ + in_RSI)) {
    local_8 = (char *)0x0;
  }
  else {
    buffer<char>::try_resize(this_00,(size_t)new_capacity);
    local_8 = buffer<char>::data(this);
    local_8 = local_8 + (long)this_00;
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR20 auto to_pointer(basic_appender<T> it, size_t n) -> T* {
  buffer<T>& buf = get_container(it);
  buf.try_reserve(buf.size() + n);
  auto size = buf.size();
  if (buf.capacity() < size + n) return nullptr;
  buf.try_resize(size + n);
  return buf.data() + size;
}